

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tftp.c
# Opt level: O0

CURLcode tftp_parse_option_ack(tftp_state_data *state,char *ptr,int len)

{
  int iVar1;
  long lVar2;
  long tsize;
  long blksize;
  char *value;
  char *option;
  Curl_easy *data;
  char *tmp;
  char *pcStack_20;
  int len_local;
  char *ptr_local;
  tftp_state_data *state_local;
  
  option = (char *)state->data;
  state->blksize = 0x200;
  data = (Curl_easy *)ptr;
  tmp._4_4_ = len;
  pcStack_20 = ptr;
  ptr_local = (char *)state;
  while( true ) {
    while( true ) {
      if ((Curl_easy *)(pcStack_20 + tmp._4_4_) <= data) {
        return CURLE_OK;
      }
      data = (Curl_easy *)
             tftp_option_get((char *)data,(size_t)(pcStack_20 + ((long)tmp._4_4_ - (long)data)),
                             &value,(char **)&blksize);
      if (data == (Curl_easy *)0x0) {
        Curl_failf((Curl_easy *)option,"Malformed ACK packet, rejecting");
        return CURLE_TFTP_ILLEGAL;
      }
      if (((option != (char *)0x0) && ((*(ulong *)(option + 0xa9a) >> 0x1c & 1) != 0)) &&
         ((*(long *)(option + 0x1320) == 0 || (0 < *(int *)(*(long *)(option + 0x1320) + 8))))) {
        Curl_infof((Curl_easy *)option,"got option=(%s) value=(%s)",value,blksize);
      }
      iVar1 = curl_strnequal(value,"blksize",7);
      if (iVar1 != 0) break;
      iVar1 = curl_strnequal(value,"tsize",5);
      if (iVar1 != 0) {
        lVar2 = strtol((char *)blksize,(char **)0x0,10);
        if (((option != (char *)0x0) && ((*(ulong *)(option + 0xa9a) >> 0x1c & 1) != 0)) &&
           ((*(long *)(option + 0x1320) == 0 || (0 < *(int *)(*(long *)(option + 0x1320) + 8))))) {
          Curl_infof((Curl_easy *)option,"%s (%ld)","tsize parsed from OACK",lVar2);
        }
        if ((*(uint *)(option + 0x139c) >> 0x11 & 1) == 0) {
          if (lVar2 == 0) {
            Curl_failf((Curl_easy *)option,"invalid tsize -:%s:- value in OACK packet",blksize);
            return CURLE_TFTP_ILLEGAL;
          }
          Curl_pgrsSetDownloadSize((Curl_easy *)option,lVar2);
        }
      }
    }
    lVar2 = strtol((char *)blksize,(char **)0x0,10);
    if (lVar2 == 0) {
      Curl_failf((Curl_easy *)option,"invalid blocksize value in OACK packet");
      return CURLE_TFTP_ILLEGAL;
    }
    if (0xffb8 < lVar2) break;
    if (lVar2 < 8) {
      Curl_failf((Curl_easy *)option,"%s (%d)","blksize is smaller than min supported",8);
      return CURLE_TFTP_ILLEGAL;
    }
    if (*(int *)(ptr_local + 0x140) < lVar2) {
      Curl_failf((Curl_easy *)option,"%s (%ld)","server requested blksize larger than allocated",
                 lVar2);
      return CURLE_TFTP_ILLEGAL;
    }
    *(int *)(ptr_local + 0x13c) = (int)lVar2;
    if (((option != (char *)0x0) && ((*(ulong *)(option + 0xa9a) >> 0x1c & 1) != 0)) &&
       ((*(long *)(option + 0x1320) == 0 || (0 < *(int *)(*(long *)(option + 0x1320) + 8))))) {
      Curl_infof((Curl_easy *)option,"%s (%d) %s (%d)","blksize parsed from OACK",
                 (ulong)*(uint *)(ptr_local + 0x13c),"requested",(ulong)*(uint *)(ptr_local + 0x140)
                );
    }
  }
  Curl_failf((Curl_easy *)option,"%s (%d)","blksize is larger than max supported",0xffb8);
  return CURLE_TFTP_ILLEGAL;
}

Assistant:

static CURLcode tftp_parse_option_ack(struct tftp_state_data *state,
                                      const char *ptr, int len)
{
  const char *tmp = ptr;
  struct Curl_easy *data = state->data;

  /* if OACK does not contain blksize option, the default (512) must be used */
  state->blksize = TFTP_BLKSIZE_DEFAULT;

  while(tmp < ptr + len) {
    const char *option, *value;

    tmp = tftp_option_get(tmp, ptr + len - tmp, &option, &value);
    if(!tmp) {
      failf(data, "Malformed ACK packet, rejecting");
      return CURLE_TFTP_ILLEGAL;
    }

    infof(data, "got option=(%s) value=(%s)", option, value);

    if(checkprefix(TFTP_OPTION_BLKSIZE, option)) {
      long blksize;

      blksize = strtol(value, NULL, 10);

      if(!blksize) {
        failf(data, "invalid blocksize value in OACK packet");
        return CURLE_TFTP_ILLEGAL;
      }
      if(blksize > TFTP_BLKSIZE_MAX) {
        failf(data, "%s (%d)", "blksize is larger than max supported",
              TFTP_BLKSIZE_MAX);
        return CURLE_TFTP_ILLEGAL;
      }
      else if(blksize < TFTP_BLKSIZE_MIN) {
        failf(data, "%s (%d)", "blksize is smaller than min supported",
              TFTP_BLKSIZE_MIN);
        return CURLE_TFTP_ILLEGAL;
      }
      else if(blksize > state->requested_blksize) {
        /* could realloc pkt buffers here, but the spec does not call out
         * support for the server requesting a bigger blksize than the client
         * requests */
        failf(data, "%s (%ld)",
              "server requested blksize larger than allocated", blksize);
        return CURLE_TFTP_ILLEGAL;
      }

      state->blksize = (int)blksize;
      infof(data, "%s (%d) %s (%d)", "blksize parsed from OACK",
            state->blksize, "requested", state->requested_blksize);
    }
    else if(checkprefix(TFTP_OPTION_TSIZE, option)) {
      long tsize = 0;

      tsize = strtol(value, NULL, 10);
      infof(data, "%s (%ld)", "tsize parsed from OACK", tsize);

      /* tsize should be ignored on upload: Who cares about the size of the
         remote file? */
      if(!data->state.upload) {
        if(!tsize) {
          failf(data, "invalid tsize -:%s:- value in OACK packet", value);
          return CURLE_TFTP_ILLEGAL;
        }
        Curl_pgrsSetDownloadSize(data, tsize);
      }
    }
  }

  return CURLE_OK;
}